

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

value_type __thiscall QList<QItemSelectionRange>::takeLast(QList<QItemSelectionRange> *this)

{
  QPersistentModelIndex extraout_RDX;
  QArrayDataPointer<QItemSelectionRange> *in_RSI;
  QPersistentModelIndex in_RDI;
  value_type vVar1;
  value_type *v;
  QItemSelectionRange *in_stack_ffffffffffffffc8;
  
  (((QItemSelectionRange *)in_RDI.d)->tl).d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  (((QItemSelectionRange *)in_RDI.d)->br).d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  last((QList<QItemSelectionRange> *)in_stack_ffffffffffffffc8);
  QItemSelectionRange::QItemSelectionRange
            ((QItemSelectionRange *)in_RDI.d,in_stack_ffffffffffffffc8);
  QArrayDataPointer<QItemSelectionRange>::operator->(in_RSI);
  QtPrivate::QGenericArrayOps<QItemSelectionRange>::eraseLast
            ((QGenericArrayOps<QItemSelectionRange> *)in_RDI.d);
  vVar1.br.d = extraout_RDX.d;
  vVar1.tl.d = in_RDI.d;
  return vVar1;
}

Assistant:

value_type takeLast() { Q_ASSERT(!isEmpty()); value_type v = std::move(last()); d->eraseLast(); return v; }